

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

void __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::ModuleImpl
          (ModuleImpl *this,Impl *loader,Own<const_kj::ReadableFile> *file,
          ReadableDirectory *sourceDir,Path *pathParam)

{
  Own<const_kj::ReadableFile> *other;
  Path *pPVar1;
  size_t sVar2;
  Fault local_48;
  Fault f;
  Path *pathParam_local;
  ReadableDirectory *sourceDir_local;
  Own<const_kj::ReadableFile> *file_local;
  Impl *loader_local;
  ModuleImpl *this_local;
  
  Module::Module(&this->super_Module);
  (this->super_Module).super_ErrorReporter._vptr_ErrorReporter =
       (_func_int **)&PTR_addError_0062bdd0;
  this->loader = loader;
  other = kj::mv<kj::Own<kj::ReadableFile_const>>(file);
  kj::Own<const_kj::ReadableFile>::Own(&this->file,other);
  this->sourceDir = sourceDir;
  pPVar1 = kj::mv<kj::Path>(pathParam);
  kj::Path::Path(&this->path,pPVar1);
  kj::Path::toString(&this->sourceNameStr,&this->path,false);
  kj::SpaceFor<capnp::compiler::LineBreakTable>::SpaceFor(&this->lineBreaksSpace);
  kj::Maybe<kj::Own<capnp::compiler::LineBreakTable>_>::Maybe(&this->lineBreaks);
  sVar2 = kj::Path::size(&this->path);
  if (sVar2 != 0) {
    return;
  }
  kj::_::Debug::Fault::Fault
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/module-loader.c++"
             ,0x98,FAILED,"path.size() > 0","");
  kj::_::Debug::Fault::fatal(&local_48);
}

Assistant:

ModuleImpl(ModuleLoader::Impl& loader, kj::Own<const kj::ReadableFile> file,
             const kj::ReadableDirectory& sourceDir, kj::Path pathParam)
      : loader(loader), file(kj::mv(file)), sourceDir(sourceDir), path(kj::mv(pathParam)),
        sourceNameStr(path.toString()) {
    KJ_REQUIRE(path.size() > 0);
  }